

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SampleMaskCase::init
          (SampleMaskCase *this,EVP_PKEY_CTX *ctx)

{
  QueryType *value;
  pointer pVVar1;
  pointer *ppVVar2;
  TestLog *log;
  Context *pCVar3;
  RenderContext *pRVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int iVar9;
  deUint32 dVar10;
  ContextType type;
  GLSLVersion version;
  undefined4 uVar11;
  undefined4 extraout_var;
  RenderTarget *pRVar13;
  MessageBuilder *this_00;
  long lVar14;
  mapped_type *pmVar15;
  ShaderProgram *pSVar16;
  ProgramSources *pPVar17;
  undefined4 extraout_var_01;
  TestError *pTVar18;
  NotSupportedError *pNVar19;
  int iVar20;
  string *description;
  int iVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  undefined1 in_XMM4 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  allocator<char> local_2c1;
  GLint maxSamples;
  GLint maxSampleMaskWords;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  undefined1 local_288 [40];
  ScopedLogSection section;
  string local_258;
  undefined1 local_238 [40];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridData;
  string local_90;
  StringTemplate local_70;
  string local_50;
  long lVar12;
  undefined4 extraout_var_00;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar9);
  maxSamples = 0;
  maxSampleMaskWords = 0;
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar13->m_width < this->m_maxSampleMaskWords) ||
     (pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context),
     pRVar13->m_height < this->m_maxSampleMaskWords)) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>((string *)local_238,&this->m_maxSampleMaskWords);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   "render target size must be at least ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   "x");
    de::toString<int>(&local_258,&this->m_maxSampleMaskWords);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gridData,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   &local_258);
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)&gridData);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar12 + 0x868))(0x8e59,&maxSampleMaskWords);
  if (maxSampleMaskWords <
      *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gridData,"Test requires larger GL_MAX_SAMPLE_MASK_WORDS",
               (allocator<char> *)&args);
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)&gridData);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar12 + 0x868))(0x910e,&maxSamples);
  if (maxSamples < (int)this->m_verifierType) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gridData,
               "Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES",
               (allocator<char> *)&args);
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)&gridData);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  gridData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppVVar2 = &gridData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
  std::operator<<((ostream *)ppVVar2,"GL_MAX_COLOR_TEXTURE_SAMPLES = ");
  std::ostream::operator<<(ppVVar2,maxSamples);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gridData,(EndMessageToken *)&tcu::TestLog::EndMessage);
  value = &this->m_verifierType;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar2);
  if ((((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 4) != 0) &&
     ((*value & QUERY_POINTER) == QUERY_BOOLEAN)) {
    gridData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppVVar2 = &gridData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
    std::operator<<((ostream *)ppVVar2,
                    "Sample count is multiple of word size. No unused high bits in sample mask.\nSkipping."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&gridData,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar2);
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gridData,
               "Test requires unused high bits (sample count not multiple of 32)",
               (allocator<char> *)&args);
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)&gridData);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  gridData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppVVar2 = &gridData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
  std::operator<<((ostream *)ppVVar2,"Creating multisample texture with sample count ");
  this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)&gridData,(int *)value);
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar2);
  (**(code **)(lVar12 + 0x6f8))
            (1,(undefined1 *)
               ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p
               + 4));
  (**(code **)(lVar12 + 0xb8))
            (0x9100,*(undefined4 *)
                     ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus
                             ._M_p + 4));
  (**(code **)(lVar12 + 0x1390))
            (0x9100,this->m_verifierType,0x8058,this->m_maxSampleMaskWords,
             this->m_maxSampleMaskWords,0);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"texStorage2DMultisample",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x28e);
  gridData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppVVar2 = &gridData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar2);
  std::operator<<((ostream *)ppVVar2,"Attaching texture to FBO");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gridData,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar2);
  (**(code **)(lVar12 + 0x6d0))
            (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
  (**(code **)(lVar12 + 0x78))
            (0x8d40,*(undefined4 *)
                     &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
  (**(code **)(lVar12 + 0x6a0))
            (0x8d40,0x8ce0,0x9100,
             *(undefined4 *)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p +
              4),0);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"framebufferTexture2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x297);
  (**(code **)(lVar12 + 0x708))
            (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"genVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x29c);
  (**(code **)(lVar12 + 0x6c8))
            (1,(undefined1 *)
               ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
               + 4));
  (**(code **)(lVar12 + 0x40))
            (0x8892,*(undefined4 *)
                     ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                             _M_string_length + 4));
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"genBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x2a0);
  iVar9 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&gridData,(long)(iVar9 * iVar9 * 6),(allocator_type *)&args);
  iVar9 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
  iVar21 = 0;
  while (iVar22 = iVar21, iVar22 < iVar9) {
    fVar23 = (float)iVar22;
    fVar24 = (float)(iVar22 + 1);
    iVar20 = 0;
    while (iVar21 = iVar22 + 1, iVar20 < iVar9) {
      auVar27._0_4_ = (float)iVar9;
      auVar5._4_8_ = in_XMM4._8_8_;
      auVar5._0_4_ = fVar23;
      auVar34._0_8_ = auVar5._0_8_ << 0x20;
      auVar34._8_4_ = fVar23;
      auVar34._12_4_ = fVar23;
      auVar25._4_12_ = auVar34._4_12_;
      auVar25._0_4_ = (float)iVar20;
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      auVar33._4_4_ = fVar23;
      auVar33._0_4_ = auVar25._0_4_;
      auVar33._8_4_ = fVar23;
      auVar33._12_4_ = fVar23;
      auVar34 = divps(auVar33,auVar27);
      pVVar1 = gridData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + (iVar9 * iVar22 + iVar20) * 6;
      *(ulong *)pVVar1->m_data =
           CONCAT44(auVar34._4_4_ + auVar34._4_4_ + -1.0,auVar34._0_4_ + auVar34._0_4_ + -1.0);
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      iVar9 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
      auVar28._0_4_ = (float)iVar9;
      auVar6._4_8_ = 0x3f80000000000000;
      auVar6._0_4_ = fVar24;
      auVar35._0_8_ = auVar6._0_8_ << 0x20;
      auVar35._8_4_ = fVar24;
      auVar35._12_4_ = fVar24;
      auVar36._4_12_ = auVar35._4_12_;
      auVar36._0_4_ = (float)iVar20;
      auVar28._4_4_ = auVar28._0_4_;
      auVar28._8_4_ = auVar28._0_4_;
      auVar28._12_4_ = auVar28._0_4_;
      auVar34 = divps(auVar36,auVar28);
      pVVar1 = gridData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + ((iVar9 * iVar22 + iVar20) * 6 + 1);
      *(ulong *)pVVar1->m_data =
           CONCAT44(auVar34._4_4_ + auVar34._4_4_ + -1.0,auVar34._0_4_ + auVar34._0_4_ + -1.0);
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      iVar9 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
      auVar37._0_4_ = (float)iVar9;
      iVar21 = iVar20 + 1;
      auVar7._4_8_ = auVar28._8_8_;
      auVar7._0_4_ = fVar24;
      auVar29._0_8_ = auVar7._0_8_ << 0x20;
      auVar29._8_4_ = fVar24;
      auVar29._12_4_ = fVar24;
      auVar30._4_12_ = auVar29._4_12_;
      auVar30._0_4_ = (float)iVar21;
      auVar37._4_4_ = auVar37._0_4_;
      auVar37._8_4_ = auVar37._0_4_;
      auVar37._12_4_ = auVar37._0_4_;
      auVar39._4_4_ = fVar24;
      auVar39._0_4_ = auVar30._0_4_;
      auVar39._8_4_ = fVar24;
      auVar39._12_4_ = fVar24;
      auVar34 = divps(auVar39,auVar37);
      pVVar1 = gridData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + ((iVar9 * iVar22 + iVar20) * 6 + 2);
      *(ulong *)pVVar1->m_data =
           CONCAT44(auVar34._4_4_ + auVar34._4_4_ + -1.0,auVar34._0_4_ + auVar34._0_4_ + -1.0);
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      iVar9 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
      auVar38._0_4_ = (float)iVar9;
      auVar38._4_4_ = auVar38._0_4_;
      auVar38._8_4_ = auVar38._0_4_;
      auVar38._12_4_ = auVar38._0_4_;
      auVar34 = divps(auVar25,auVar38);
      pVVar1 = gridData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + ((iVar9 * iVar22 + iVar20) * 6 + 3);
      *(ulong *)pVVar1->m_data =
           CONCAT44(auVar34._4_4_ + auVar34._4_4_ + -1.0,auVar34._0_4_ + auVar34._0_4_ + -1.0);
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      iVar9 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
      auVar26._0_4_ = (float)iVar9;
      auVar26._4_4_ = auVar26._0_4_;
      auVar26._8_4_ = auVar26._0_4_;
      auVar26._12_4_ = auVar26._0_4_;
      auVar34 = divps(auVar30,auVar26);
      pVVar1 = gridData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + ((iVar9 * iVar22 + iVar20) * 6 + 4);
      *(ulong *)pVVar1->m_data =
           CONCAT44(auVar34._4_4_ + auVar34._4_4_ + -1.0,auVar34._0_4_ + auVar34._0_4_ + -1.0);
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      iVar9 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
      in_XMM4._0_4_ = (float)iVar9;
      auVar8._4_8_ = 0x3f80000000000000;
      auVar8._0_4_ = fVar23;
      auVar31._0_8_ = auVar8._0_8_ << 0x20;
      auVar31._8_4_ = fVar23;
      auVar31._12_4_ = fVar23;
      auVar32._4_12_ = auVar31._4_12_;
      auVar32._0_4_ = (float)iVar21;
      in_XMM4._4_4_ = in_XMM4._0_4_;
      in_XMM4._8_4_ = in_XMM4._0_4_;
      in_XMM4._12_4_ = in_XMM4._0_4_;
      auVar34 = divps(auVar32,in_XMM4);
      pVVar1 = gridData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + ((iVar9 * iVar22 + iVar20) * 6 + 5);
      *(ulong *)pVVar1->m_data =
           CONCAT44(auVar34._4_4_ + auVar34._4_4_ + -1.0,auVar34._0_4_ + auVar34._0_4_ + -1.0);
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      iVar20 = iVar21;
      iVar9 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
    }
  }
  (**(code **)(lVar12 + 0x150))
            (0x8892,(long)((int)gridData.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)gridData.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             gridData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"bufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x2b2);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&gridData.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gridData,"GenerateSamplerShader",(allocator<char> *)local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&args,"Generate sampler shader",(allocator<char> *)local_238);
  description = (string *)&args;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&gridData,description);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::string::~string((string *)&gridData);
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var_00,iVar9);
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gridData,"GLSL_VERSION_DECL",(allocator<char> *)local_288);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&args,(key_type *)&gridData);
  std::__cxx11::string::assign((char *)pmVar15);
  std::__cxx11::string::~string((string *)&gridData);
  de::toString<int>((string *)&gridData,(int *)value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_288,"NUMSAMPLES",(allocator<char> *)local_238);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&args,(key_type *)local_288);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&gridData);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)&gridData);
  pSVar16 = (ShaderProgram *)operator_new(0xd0);
  pCVar3 = (this->super_TestCase).m_context;
  pRVar4 = pCVar3->m_renderCtx;
  memset(&gridData,0,0xac);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_258,(_anonymous_namespace_ *)pCVar3,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,(char *)description);
  glu::VertexSource::VertexSource((VertexSource *)local_288,&local_258);
  pPVar17 = glu::ProgramSources::operator<<((ProgramSources *)&gridData,(ShaderSource *)local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nuniform highp sampler2DMS u_sampler;\nuniform highp int u_sample;\nvoid main (void)\n{\n\thighp float correctCoverage = 0.0;\n\thighp float incorrectCoverage = 0.0;\n\thighp ivec2 texelPos = ivec2(int(floor(gl_FragCoord.x)), int(floor(gl_FragCoord.y)));\n\n\tfor (int sampleNdx = 0; sampleNdx < ${NUMSAMPLES}; ++sampleNdx)\n\t{\n\t\thighp float sampleColor = texelFetch(u_sampler, texelPos, sampleNdx).r;\n\t\tif (sampleNdx == u_sample)\n\t\t\tcorrectCoverage += sampleColor;\n\t\telse\n\t\t\tincorrectCoverage += sampleColor;\n\t}\n\tfragColor = vec4(correctCoverage, incorrectCoverage, 0.0, 1.0);\n}\n"
             ,&local_2c1);
  tcu::StringTemplate::StringTemplate(&local_70,&local_90);
  tcu::StringTemplate::specialize(&local_50,&local_70,&args);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_238,&local_50);
  pPVar17 = glu::ProgramSources::operator<<(pPVar17,(ShaderSource *)local_238);
  glu::ShaderProgram::ShaderProgram(pSVar16,pRVar4,pPVar17);
  *(ShaderProgram **)
   ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = pSVar16;
  std::__cxx11::string::~string((string *)(local_238 + 8));
  std::__cxx11::string::~string((string *)&local_50);
  tcu::StringTemplate::~StringTemplate(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)(local_288 + 8));
  std::__cxx11::string::~string((string *)&local_258);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&gridData);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  *(ShaderProgram **)
                   ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8))
  ;
  lVar12 = *(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
  ;
  if (*(char *)(lVar12 + 0xc0) == '\0') {
    pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gridData,"Could not create sampler program.",(allocator<char> *)local_288)
    ;
    tcu::TestError::TestError(pTVar18,(string *)&gridData);
    __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar11 = (**(code **)(lVar14 + 0x780))(*(undefined4 *)(lVar12 + 0x98),"a_position");
  *(undefined4 *)
   &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p = uVar11;
  uVar11 = (**(code **)(lVar14 + 0xb48))
                     (*(undefined4 *)
                       (*(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name
                                         .field_2 + 8) + 0x98),"u_sampler");
  *(undefined4 *)
   ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4)
       = uVar11;
  uVar11 = (**(code **)(lVar14 + 0xb48))
                     (*(undefined4 *)
                       (*(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name
                                         .field_2 + 8) + 0x98));
  *(undefined4 *)
   &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_string_length = uVar11;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&args._M_t);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pSVar16 = (ShaderProgram *)operator_new(0xd0);
  pCVar3 = (this->super_TestCase).m_context;
  pRVar4 = pCVar3->m_renderCtx;
  memset(&gridData,0,0xac);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_238,(_anonymous_namespace_ *)pCVar3,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp float v_alpha;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_alpha = (a_position.x * 0.5 + 0.5)*(a_position.y * 0.5 + 0.5);\n}\n"
             ,(char *)description);
  glu::VertexSource::VertexSource((VertexSource *)&args,(string *)local_238);
  pPVar17 = glu::ProgramSources::operator<<((ProgramSources *)&gridData,(ShaderSource *)&args);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_258,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nin mediump float v_alpha;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, v_alpha);\n}\n"
             ,(char *)description);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_288,&local_258);
  pPVar17 = glu::ProgramSources::operator<<(pPVar17,(ShaderSource *)local_288);
  glu::ShaderProgram::ShaderProgram(pSVar16,pRVar4,pPVar17);
  *(ShaderProgram **)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 =
       pSVar16;
  std::__cxx11::string::~string((string *)(local_288 + 8));
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&args._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::~string((string *)local_238);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&gridData);
  pSVar16 = (ShaderProgram *)
            this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
            _M_allocated_capacity;
  if ((pSVar16->m_program).m_info.linkOk == false) {
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar16)
    ;
    pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gridData,"Could not create aplha program.",(allocator<char> *)&args);
    tcu::TestError::TestError(pTVar18,(string *)&gridData);
    __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar9 = (**(code **)(CONCAT44(extraout_var_01,iVar9) + 0x780))
                    ((pSVar16->m_program).m_program,"a_position");
  *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 + 8) =
       iVar9;
  return iVar9;
}

Assistant:

void SampleMaskCase::init (void)
{
	// log the test method and expectations
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying gl_SampleMaskIn value with SAMPLE_MASK state. gl_SampleMaskIn does not contain any bits set that are have been killed by SAMPLE_MASK state. Expecting:\n"
		<< "	1) With multisample targets: gl_SampleMaskIn AND ~(SAMPLE_MASK) should be zero.\n"
		<< "	2) With non-multisample targets: SAMPLE_MASK state is only ANDed as a multisample operation. gl_SampleMaskIn should only have its last bit set regardless of SAMPLE_MASK state.\n"
		<< tcu::TestLog::EndMessage;

	SampleMaskBaseCase::init();
}